

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

ggml_status ggml_backend_sched_graph_compute(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  _func_void_ggml_backend_t *p_Var1;
  ggml_status gVar2;
  int iVar3;
  long lVar4;
  
  gVar2 = ggml_backend_sched_graph_compute_async(sched,graph);
  iVar3 = sched->n_backends;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      p_Var1 = (sched->backends[lVar4]->iface).synchronize;
      if (p_Var1 != (_func_void_ggml_backend_t *)0x0) {
        (*p_Var1)(sched->backends[lVar4]);
        iVar3 = sched->n_backends;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  return gVar2;
}

Assistant:

enum ggml_status ggml_backend_sched_graph_compute(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    enum ggml_status err = ggml_backend_sched_graph_compute_async(sched, graph);
    ggml_backend_sched_synchronize(sched);
    return err;
}